

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O1

void __thiscall VCCluster::addItem(VCCluster *this,VCFace *f)

{
  _Rb_tree_header *p_Var1;
  double dVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
  tmp;
  scalar_sum_op<double> local_29;
  VCFace *local_28;
  SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
  local_20;
  
  p_Var1 = &(this->items)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = (this->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[*(VCFace **)(p_Var4 + 1) < f]) {
    if (*(VCFace **)(p_Var4 + 1) >= f) {
      p_Var3 = p_Var4;
    }
  }
  p_Var4 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) && (p_Var4 = p_Var3, f < *(VCFace **)(p_Var3 + 1))) {
    p_Var4 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var4 == p_Var1) {
    local_28 = f;
    std::
    _Rb_tree<VCFace*,VCFace*,std::_Identity<VCFace*>,std::less<VCFace*>,std::allocator<VCFace*>>::
    _M_insert_unique<VCFace*const&>
              ((_Rb_tree<VCFace*,VCFace*,std::_Identity<VCFace*>,std::less<VCFace*>,std::allocator<VCFace*>>
                *)&this->items,&local_28);
    this->area = local_28->area + this->area;
    dVar2 = local_28->area;
    (this->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[0] =
         (local_28->center).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[0] * dVar2 +
         (this->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[0];
    (this->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[1] =
         (local_28->center).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[1] * dVar2 +
         (this->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[1];
    (this->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[2] =
         dVar2 * (local_28->center).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[2] +
         (this->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[2];
    local_28->cluster = this;
    local_20.m_matrix = &this->E;
    local_20.m_functor = &local_29;
    Eigen::
    SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
    ::operator=(&local_20,&local_28->E);
    (**this->_vptr_VCCluster)(this,local_28);
  }
  return;
}

Assistant:

void VCCluster::addItem(VCFace* f) {
	if (items.find(f) == items.end()) {
		items.insert(f);
		area += f->area;
		weightedSum = weightedSum + f->center * f->area;
		f->cluster = this;
		E += f->E;
		addItemAdditionalAct(f);
	}
}